

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QMdiSubWindow * __thiscall QMdiArea::currentSubWindow(QMdiArea *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QWidget *this_00;
  QMdiSubWindow *pQVar4;
  long lVar5;
  undefined8 *puVar6;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (*(long *)(lVar1 + 0x368) == 0) {
LAB_0040d20b:
    pQVar4 = (QMdiSubWindow *)0x0;
  }
  else {
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x388));
    if (bVar3) {
      lVar2 = *(long *)(lVar1 + 0x388);
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) goto LAB_0040d20b;
      puVar6 = (undefined8 *)(lVar1 + 0x390);
    }
    else {
      if (*(char *)(lVar1 + 0x3ca) == '\x01') {
        this_00 = QWidget::window((QWidget *)this);
        bVar3 = QWidget::isMinimized(this_00);
        if (!bVar3) goto LAB_0040d20b;
      }
      lVar5 = (long)**(int **)(lVar1 + 0x378) * 0x10;
      lVar2 = *(long *)(*(long *)(lVar1 + 0x360) + lVar5);
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) goto LAB_0040d20b;
      puVar6 = (undefined8 *)(*(long *)(lVar1 + 0x360) + lVar5 + 8);
    }
    pQVar4 = (QMdiSubWindow *)*puVar6;
  }
  return pQVar4;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }